

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniset.cpp
# Opt level: O2

void __thiscall icu_63::UnicodeSet::setPattern(UnicodeSet *this,UnicodeString *newPat)

{
  short sVar1;
  char16_t *dst;
  int limit;
  
  releasePattern(this);
  sVar1 = (newPat->fUnion).fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    limit = (newPat->fUnion).fFields.fLength;
  }
  else {
    limit = (int)sVar1 >> 5;
  }
  dst = (char16_t *)uprv_malloc_63((long)limit * 2 + 2);
  this->pat = dst;
  if (dst != (char16_t *)0x0) {
    this->patLen = limit;
    UnicodeString::extractBetween(newPat,0,limit,dst,0);
    this->pat[this->patLen] = L'\0';
  }
  return;
}

Assistant:

void UnicodeSet::setPattern(const UnicodeString& newPat) {
    releasePattern();
    int32_t newPatLen = newPat.length();
    pat = (UChar *)uprv_malloc((newPatLen + 1) * sizeof(UChar));
    if (pat) {
        patLen = newPatLen;
        newPat.extractBetween(0, patLen, pat);
        pat[patLen] = 0;
    }
    // else we don't care if malloc failed. This was just a nice cache.
    // We can regenerate an equivalent pattern later when requested.
}